

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O0

int opencc_dict_load(opencc_t t_opencc,char *dict_filename,opencc_dictionary_type dict_type)

{
  dictionary_set_t pvVar1;
  dictionary_group_t pvStack_38;
  int retval;
  dictionary_group_t dictionary_group;
  opencc_desc *opencc;
  opencc_dictionary_type dict_type_local;
  char *dict_filename_local;
  opencc_t t_opencc_local;
  
  if (lib_initialized == 0) {
    lib_initialize();
  }
  if (*t_opencc == 0) {
    pvVar1 = dictionary_set_open();
    *(dictionary_set_t *)t_opencc = pvVar1;
    pvStack_38 = dictionary_set_new_group(*t_opencc);
  }
  else {
    pvStack_38 = dictionary_set_get_group(*t_opencc,0);
  }
  t_opencc_local._4_4_ = dictionary_group_load(pvStack_38,dict_filename,dict_type);
  if (t_opencc_local._4_4_ == -1) {
    errnum = OPENCC_ERROR_DICTLOAD;
    t_opencc_local._4_4_ = -1;
  }
  else {
    converter_assign_dictionary(*(converter_t *)((long)t_opencc + 8),*t_opencc);
  }
  return t_opencc_local._4_4_;
}

Assistant:

int opencc_dict_load(opencc_t t_opencc, const char * dict_filename,
		opencc_dictionary_type dict_type)
{
	if (!lib_initialized)
		lib_initialize();

	opencc_desc * opencc = (opencc_desc *) t_opencc;

	dictionary_group_t dictionary_group;
	if (opencc->dictionary_set == NULL)
	{
		opencc->dictionary_set = dictionary_set_open();
		dictionary_group = dictionary_set_new_group(opencc->dictionary_set);
	}
	else
	{
		dictionary_group = dictionary_set_get_group(opencc->dictionary_set, 0);
	}

	int retval;
	retval = dictionary_group_load(dictionary_group, dict_filename, dict_type);

	if (retval == -1)
	{
		errnum = OPENCC_ERROR_DICTLOAD;
		return -1;
	}

	converter_assign_dictionary(opencc->converter, opencc->dictionary_set);

	return retval;
}